

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O0

bool __thiscall TSDemuxer::checkForRealM2ts(TSDemuxer *this,uint8_t *buffer,uint8_t *end)

{
  ostream *poVar1;
  uint8_t *local_38;
  uint8_t *cur_1;
  uint8_t *cur;
  uint8_t *end_local;
  uint8_t *buffer_local;
  TSDemuxer *this_local;
  
  for (cur_1 = buffer; local_38 = buffer, cur_1 < end; cur_1 = cur_1 + 0xc0) {
    if (cur_1[4] != 'G') {
      return false;
    }
  }
  while( true ) {
    if (end <= local_38) {
      return false;
    }
    if (*local_38 != 'G') break;
    local_38 = local_38 + 0xbc;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Warning! The file ");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_streamName);
  poVar1 = std::operator<<(poVar1," has a M2TS format.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  sLastMsg = true;
  return true;
}

Assistant:

bool TSDemuxer::checkForRealM2ts(const uint8_t* buffer, const uint8_t* end) const
{
    for (const uint8_t* cur = buffer; cur < end; cur += 192)
        if (cur[4] != 0x47)
            return false;
    for (const uint8_t* cur = buffer; cur < end; cur += 188)
        if (*cur != 0x47)
        {
            LTRACE(LT_WARN, 2, "Warning! The file " << m_streamName << " has a M2TS format.");
            return true;
        }
    return false;
}